

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O2

void lws_seq_sul_pending_cb(lws_sorted_usec_list_t *sul)

{
  lws_dll2 *d;
  int iVar1;
  lws_seq_t *seq;
  
  seq = (lws_seq_t *)&sul[-2].list.owner;
  if (*(int *)&sul[1].list.owner != 0) {
    d = sul[1].list.next;
    iVar1 = (*(code *)sul[1].us)(seq,sul + 3,*(undefined4 *)&d[1].owner,d[1].prev,d[1].next);
    lws_dll2_remove(d);
    lws_realloc(d,0,"lws_free");
    if (iVar1 != 0) {
      _lws_log(8,"%s: destroying seq \'%s\' by request\n","lws_seq_sul_pending_cb",sul[2].list.prev)
      ;
      lws_seq_destroy(&seq);
    }
  }
  return;
}

Assistant:

static void
lws_seq_sul_pending_cb(lws_sorted_usec_list_t *sul)
{
	lws_seq_t *seq = lws_container_of(sul, lws_seq_t, sul_pending);
	lws_seq_event_t *seqe;
	struct lws_dll2 *dh;
	int n;

	if (!seq->seq_event_owner.count)
		return;

	/* events are only added at tail, so no race possible yet... */

	dh = lws_dll2_get_head(&seq->seq_event_owner);
	seqe = lws_container_of(dh, lws_seq_event_t, seq_event_list);

	n = seq->cb(seq, (void *)&seq[1], seqe->e, seqe->data, seqe->aux);

	/* ... have to lock here though, because we will change the list */

	lws_pt_lock(seq->pt, __func__); /* ----------------------------- pt { */

	/* detach event from sequencer event list and free it */
	lws_dll2_remove(&seqe->seq_event_list);
	lws_free(seqe);
	lws_pt_unlock(seq->pt); /* } pt ------------------------------------- */

	if (n) {
		lwsl_info("%s: destroying seq '%s' by request\n", __func__,
				seq->name);
		lws_seq_destroy(&seq);
	}
}